

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocker.cc
# Opt level: O2

void __thiscall
webrtc::Blocker::ProcessChunk
          (Blocker *this,float **input,size_t chunk_size,size_t num_input_channels,
          size_t num_output_channels,float **output)

{
  ChannelBuffer<float> *this_00;
  float *pfVar1;
  size_t sVar2;
  size_t sVar3;
  BlockerCallback *pBVar4;
  ulong uVar5;
  ChannelBuffer<float> *pCVar6;
  AudioRingBuffer *this_01;
  string *result;
  float **ppfVar7;
  float **ppfVar8;
  float **ppfVar9;
  int line;
  size_t sVar10;
  size_t i_2;
  size_t sVar11;
  size_t i;
  size_t i_1;
  size_t local_1e8;
  ulong local_1e0;
  ChannelBuffer<float> *local_1d8;
  ChannelBuffer<float> *local_1d0;
  AudioRingBuffer *local_1c8;
  float **local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  FatalMessage local_1a8;
  
  local_1e8 = num_input_channels;
  local_1c0 = output;
  local_1b8 = num_output_channels;
  local_1b0 = chunk_size;
  result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                     (&local_1b0,&this->chunk_size_,"chunk_size == chunk_size_");
  if (result == (string *)0x0) {
    result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&local_1e8,&this->num_input_channels_,
                        "num_input_channels == num_input_channels_");
    if (result == (string *)0x0) {
      result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                         (&local_1b8,&this->num_output_channels_,
                          "num_output_channels == num_output_channels_");
      if (result == (string *)0x0) {
        local_1c8 = &this->input_buffer_;
        AudioRingBuffer::Write(local_1c8,input,local_1e8,this->chunk_size_);
        local_1d0 = &this->input_block_;
        local_1d8 = &this->output_block_;
        this_00 = &this->output_buffer_;
        local_1e0 = this->frame_offset_;
        while (pCVar6 = local_1d0, local_1e0 < this->chunk_size_) {
          ppfVar7 = ChannelBuffer<float>::channels(local_1d0);
          this_01 = local_1c8;
          AudioRingBuffer::Read(local_1c8,ppfVar7,local_1e8,this->block_size_);
          AudioRingBuffer::MoveReadPositionBackward(this_01,this->block_size_ - this->shift_amount_)
          ;
          pfVar1 = (this->window_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl;
          sVar2 = this->block_size_;
          sVar3 = this->num_input_channels_;
          ppfVar7 = ChannelBuffer<float>::channels(pCVar6);
          anon_unknown.dwarf_4784f::ApplyWindow(pfVar1,sVar2,sVar3,ppfVar7);
          pBVar4 = this->callback_;
          ppfVar7 = ChannelBuffer<float>::channels(pCVar6);
          pCVar6 = local_1d8;
          sVar2 = this->block_size_;
          sVar3 = this->num_input_channels_;
          sVar10 = this->num_output_channels_;
          ppfVar8 = ChannelBuffer<float>::channels(local_1d8);
          (*pBVar4->_vptr_BlockerCallback[2])(pBVar4,ppfVar7,sVar2,sVar3,sVar10,ppfVar8);
          pfVar1 = (this->window_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl;
          sVar2 = this->block_size_;
          sVar3 = this->num_output_channels_;
          ppfVar7 = ChannelBuffer<float>::channels(pCVar6);
          anon_unknown.dwarf_4784f::ApplyWindow(pfVar1,sVar2,sVar3,ppfVar7);
          ppfVar7 = ChannelBuffer<float>::channels(this_00);
          ppfVar8 = ChannelBuffer<float>::channels(pCVar6);
          uVar5 = local_1e0;
          sVar2 = this->block_size_;
          sVar3 = this->num_output_channels_;
          ppfVar9 = ChannelBuffer<float>::channels(this_00);
          for (sVar10 = 0; sVar10 != sVar3; sVar10 = sVar10 + 1) {
            for (sVar11 = 0; sVar2 != sVar11; sVar11 = sVar11 + 1) {
              ppfVar9[sVar10][uVar5 + sVar11] =
                   ppfVar7[sVar10][uVar5 + sVar11] + ppfVar8[sVar10][sVar11];
            }
          }
          local_1e0 = uVar5 + this->shift_amount_;
        }
        ppfVar7 = ChannelBuffer<float>::channels(this_00);
        sVar2 = this->chunk_size_;
        sVar3 = this->num_output_channels_;
        for (sVar10 = 0; sVar3 != sVar10; sVar10 = sVar10 + 1) {
          memcpy(local_1c0[sVar10],ppfVar7[sVar10],sVar2 << 2);
        }
        ppfVar7 = ChannelBuffer<float>::channels(this_00);
        sVar10 = local_1b0;
        sVar2 = this->num_output_channels_;
        sVar3 = this->initial_delay_;
        ppfVar8 = ChannelBuffer<float>::channels(this_00);
        for (sVar11 = 0; sVar2 != sVar11; sVar11 = sVar11 + 1) {
          memmove(ppfVar8[sVar11],ppfVar7[sVar11] + sVar10,sVar3 << 2);
        }
        ppfVar7 = ChannelBuffer<float>::channels(this_00);
        sVar2 = this->initial_delay_;
        sVar3 = this->chunk_size_;
        sVar10 = this->num_output_channels_;
        for (sVar11 = 0; sVar10 != sVar11; sVar11 = sVar11 + 1) {
          memset(ppfVar7[sVar11] + sVar2,0,sVar3 << 2);
        }
        this->frame_offset_ = local_1e0 - this->chunk_size_;
        return;
      }
      line = 0xae;
    }
    else {
      line = 0xad;
    }
  }
  else {
    line = 0xac;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/blocker.cc"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void Blocker::ProcessChunk(const float* const* input,
                           size_t chunk_size,
                           size_t num_input_channels,
                           size_t num_output_channels,
                           float* const* output) {
  RTC_CHECK_EQ(chunk_size, chunk_size_);
  RTC_CHECK_EQ(num_input_channels, num_input_channels_);
  RTC_CHECK_EQ(num_output_channels, num_output_channels_);

  input_buffer_.Write(input, num_input_channels, chunk_size_);
  size_t first_frame_in_block = frame_offset_;

  // Loop through blocks.
  while (first_frame_in_block < chunk_size_) {
    input_buffer_.Read(input_block_.channels(), num_input_channels,
                       block_size_);
    input_buffer_.MoveReadPositionBackward(block_size_ - shift_amount_);

    ApplyWindow(window_.get(),
                block_size_,
                num_input_channels_,
                input_block_.channels());
    callback_->ProcessBlock(input_block_.channels(),
                            block_size_,
                            num_input_channels_,
                            num_output_channels_,
                            output_block_.channels());
    ApplyWindow(window_.get(),
                block_size_,
                num_output_channels_,
                output_block_.channels());

    AddFrames(output_buffer_.channels(),
              first_frame_in_block,
              output_block_.channels(),
              0,
              block_size_,
              num_output_channels_,
              output_buffer_.channels(),
              first_frame_in_block);

    first_frame_in_block += shift_amount_;
  }

  // Copy output buffer to output
  CopyFrames(output_buffer_.channels(),
             0,
             chunk_size_,
             num_output_channels_,
             output,
             0);

  // Copy output buffer [chunk_size_, chunk_size_ + initial_delay]
  // to output buffer [0, initial_delay], zero the rest.
  MoveFrames(output_buffer_.channels(),
             chunk_size,
             initial_delay_,
             num_output_channels_,
             output_buffer_.channels(),
             0);
  ZeroOut(output_buffer_.channels(),
          initial_delay_,
          chunk_size_,
          num_output_channels_);

  // Calculate new starting frames.
  frame_offset_ = first_frame_in_block - chunk_size_;
}